

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O1

bool __thiscall
ON_BinaryArchive::UpdateManifestMapItemDestination
          (ON_BinaryArchive *this,ON_ManifestMapItem *map_item)

{
  bool bVar1;
  Type TVar2;
  archive_mode aVar3;
  char *sFormat;
  int line_number;
  
  aVar3 = Mode(this);
  if (aVar3 == read3dm) {
    bVar1 = ON_ManifestMapItem::SourceIsUnset(map_item);
    if (!bVar1) {
      TVar2 = ON_ManifestMapItem::ComponentType(map_item);
      bVar1 = ON_ManifestMap::UpdatetMapItemDestination
                        (&this->m_manifest_map,map_item,TVar2 == Group);
      return bVar1;
    }
    sFormat = "map_item source information is not set.";
    line_number = 0xd67;
  }
  else {
    sFormat = "archive mode != ON::archive_mode::read3dm";
    line_number = 0xd62;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
             ,line_number,"",sFormat);
  return false;
}

Assistant:

bool ON_BinaryArchive::UpdateManifestMapItemDestination(
  const class ON_ManifestMapItem& map_item
  )
{
  if (ON::archive_mode::read3dm != this->Mode())
  {
    ON_ERROR("archive mode != ON::archive_mode::read3dm");
    return false;
  }
  if (map_item.SourceIsUnset())
  {
    ON_ERROR("map_item source information is not set.");
    return false;
  }

  const bool bIgnoreSourceIndex = (ON_ModelComponent::Type::Group == map_item.ComponentType());

  return m_manifest_map.UpdatetMapItemDestination(map_item, bIgnoreSourceIndex);
}